

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersect.hpp
# Opt level: O2

iterator_range<burst::intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>_>
* __thiscall
burst::intersect_t::operator()
          (iterator_range<burst::intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>_>
           *__return_storage_ptr__,intersect_t *this,
          tuple<const_std::__cxx11::list<int,_std::allocator<int>_>_&,_const_std::__cxx11::list<int,_std::allocator<int>_>_&>
          *args,greater<void> *args_1)

{
  intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>
  end;
  intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>
  begin;
  intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>
  local_100;
  intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>
  local_c8;
  intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>
  local_90;
  intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>
  local_58;
  
  make_intersect_iterator<std::__cxx11::list<int,std::allocator<int>>const,std::__cxx11::list<int,std::allocator<int>>const,std::greater<void>>
            (&local_58);
  intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>
  ::intersect_iterator(&local_90,&local_58);
  intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>
  ::intersect_iterator(&local_c8,&local_58);
  intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>
  ::intersect_iterator(&local_100,&local_90);
  boost::
  make_iterator_range<burst::intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>>,std::allocator<boost::iterator_range<std::_List_const_iterator<int>>>>>,std::greater<void>>>
            (__return_storage_ptr__,(boost *)&local_c8,&local_100,
             (intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>
              *)args_1);
  intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>
  ::~intersect_iterator(&local_100);
  intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>
  ::~intersect_iterator(&local_c8);
  intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>
  ::~intersect_iterator(&local_90);
  intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>
  ::~intersect_iterator(&local_58);
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Args && ... args) const
        {
            auto begin = make_intersect_iterator(std::forward<Args>(args)...);
            auto end = make_intersect_iterator(iterator::end_tag, begin);

            return boost::make_iterator_range(std::move(begin), std::move(end));
        }